

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUBNO055.cpp
# Opt level: O2

bool __thiscall RTIMUBNO055::IMURead(RTIMUBNO055 *this)

{
  bool bVar1;
  uint64_t uVar2;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uchar buffer [24];
  
  uVar2 = RTMath::currentUSecsSinceEpoch();
  if ((this->super_RTIMU).m_sampleInterval <= uVar2 - this->m_lastReadTime) {
    uVar2 = RTMath::currentUSecsSinceEpoch();
    this->m_lastReadTime = uVar2;
    bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                              '\b','\x18',buffer,"Failed to read BNO055 data");
    if (bVar1) {
      auVar3[4] = buffer[4];
      auVar3[5] = buffer[5];
      auVar3[0] = buffer[0];
      auVar3[1] = buffer[1];
      auVar3[2] = buffer[2];
      auVar3[3] = buffer[3];
      auVar3[6] = buffer[6];
      auVar3[7] = buffer[7];
      auVar3[8] = buffer[8];
      auVar3[9] = buffer[9];
      auVar3[10] = buffer[10];
      auVar3[0xb] = buffer[0xb];
      auVar3[0xc] = buffer[0xc];
      auVar3[0xd] = buffer[0xd];
      auVar3[0xe] = buffer[0xe];
      auVar3[0xf] = buffer[0xf];
      auVar3 = pshuflw(extraout_XMM0,auVar3,0x60);
      auVar4._0_8_ = (double)(auVar3._0_4_ >> 0x10);
      auVar4._8_8_ = (double)(auVar3._4_4_ >> 0x10);
      auVar3 = divpd(auVar4,_DAT_00121720);
      *(ulong *)(this->super_RTIMU).m_imuData.accel.m_data =
           CONCAT44((float)auVar3._0_8_,(float)auVar3._8_8_);
      (this->super_RTIMU).m_imuData.accel.m_data[2] = (float)(int)(short)buffer._4_2_ / 1000.0;
      auVar3 = pshuflw(ZEXT416((uint)buffer._6_4_),ZEXT416((uint)buffer._6_4_),0x60);
      *(ulong *)(this->super_RTIMU).m_imuData.compass.m_data =
           CONCAT44((float)(auVar3._0_4_ >> 0x10) * -0.0625,(float)(auVar3._4_4_ >> 0x10) * -0.0625)
      ;
      (this->super_RTIMU).m_imuData.compass.m_data[2] = (float)(int)(short)buffer._10_2_ * -0.0625;
      auVar3 = pshuflw(ZEXT416((uint)buffer._12_4_),ZEXT416((uint)buffer._12_4_),0x60);
      auVar5._8_4_ = (float)(auVar3._8_4_ >> 0x10);
      auVar5._12_4_ = (float)(auVar3._12_4_ >> 0x10);
      auVar5._4_4_ = (float)(auVar3._0_4_ >> 0x10);
      auVar5._0_4_ = (float)(auVar3._4_4_ >> 0x10);
      auVar3 = divps(auVar5,ZEXT816(0xc4610000c4610000));
      *(long *)(this->super_RTIMU).m_imuData.gyro.m_data = auVar3._0_8_;
      (this->super_RTIMU).m_imuData.gyro.m_data[2] = (float)(int)(short)buffer._16_2_ / -900.0;
      auVar3 = pshuflw(ZEXT416((uint)buffer._20_4_),ZEXT416((uint)buffer._20_4_),0x60);
      auVar6._0_8_ = (double)(auVar3._0_4_ >> 0x10);
      auVar6._8_8_ = (double)(auVar3._4_4_ >> 0x10);
      auVar3 = divpd(auVar6,_DAT_00121750);
      *(ulong *)(this->super_RTIMU).m_imuData.fusionPose.m_data =
           CONCAT44((float)auVar3._8_8_,(float)auVar3._0_8_);
      (this->super_RTIMU).m_imuData.fusionPose.m_data[2] = (float)(int)(short)buffer._18_2_ / 900.0;
      RTQuaternion::fromEuler
                (&(this->super_RTIMU).m_imuData.fusionQPose,
                 &(this->super_RTIMU).m_imuData.fusionPose);
      uVar2 = RTMath::currentUSecsSinceEpoch();
      (this->super_RTIMU).m_imuData.timestamp = uVar2;
      return true;
    }
  }
  return false;
}

Assistant:

bool RTIMUBNO055::IMURead()
{
    unsigned char buffer[24];

    if ((RTMath::currentUSecsSinceEpoch() - m_lastReadTime) < m_sampleInterval)
        return false;                                       // too soon

    m_lastReadTime = RTMath::currentUSecsSinceEpoch();
    if (!m_settings->HALRead(m_slaveAddr, BNO055_ACCEL_DATA, 24, buffer, "Failed to read BNO055 data"))
        return false;

    int16_t x, y, z;

    // process accel data

    x = (((uint16_t)buffer[1]) << 8) | ((uint16_t)buffer[0]);
    y = (((uint16_t)buffer[3]) << 8) | ((uint16_t)buffer[2]);
    z = (((uint16_t)buffer[5]) << 8) | ((uint16_t)buffer[4]);

    m_imuData.accel.setX((RTFLOAT)y / 1000.0);
    m_imuData.accel.setY((RTFLOAT)x / 1000.0);
    m_imuData.accel.setZ((RTFLOAT)z / 1000.0);

    // process mag data

    x = (((uint16_t)buffer[7]) << 8) | ((uint16_t)buffer[6]);
    y = (((uint16_t)buffer[9]) << 8) | ((uint16_t)buffer[8]);
    z = (((uint16_t)buffer[11]) << 8) | ((uint16_t)buffer[10]);

    m_imuData.compass.setX(-(RTFLOAT)y / 16.0);
    m_imuData.compass.setY(-(RTFLOAT)x / 16.0);
    m_imuData.compass.setZ(-(RTFLOAT)z / 16.0);

    // process gyro data

    x = (((uint16_t)buffer[13]) << 8) | ((uint16_t)buffer[12]);
    y = (((uint16_t)buffer[15]) << 8) | ((uint16_t)buffer[14]);
    z = (((uint16_t)buffer[17]) << 8) | ((uint16_t)buffer[16]);

    m_imuData.gyro.setX(-(RTFLOAT)y / 900.0);
    m_imuData.gyro.setY(-(RTFLOAT)x / 900.0);
    m_imuData.gyro.setZ(-(RTFLOAT)z / 900.0);

    // process euler angles

    x = (((uint16_t)buffer[19]) << 8) | ((uint16_t)buffer[18]);
    y = (((uint16_t)buffer[21]) << 8) | ((uint16_t)buffer[20]);
    z = (((uint16_t)buffer[23]) << 8) | ((uint16_t)buffer[22]);

    //  put in structure and do axis remap

    m_imuData.fusionPose.setX((RTFLOAT)y / 900.0);
    m_imuData.fusionPose.setY((RTFLOAT)z / 900.0);
    m_imuData.fusionPose.setZ((RTFLOAT)x / 900.0);

    m_imuData.fusionQPose.fromEuler(m_imuData.fusionPose);

    m_imuData.timestamp = RTMath::currentUSecsSinceEpoch();
    return true;
}